

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Insert_Leaf(BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *C,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,Addr p)

{
  pointer pcVar1;
  pointer pAVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_90,C);
  Buffer::Lock(&blocks,local_90.self.BlockNum);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode(&local_90);
  uVar4 = this->N;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar4) {
    uVar6 = (ulong)uVar4;
  }
  do {
    if (uVar6 == uVar5) {
LAB_0012f963:
      lVar9 = 0;
      lVar8 = 0;
      while (((lVar8 < (int)uVar4 &&
              ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8] == '1')) &&
             (bVar3 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&(((C->k).
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                _M_dataplus)._M_p + lVar9),k), bVar3))) {
        lVar8 = lVar8 + 1;
        uVar4 = this->N;
        lVar9 = lVar9 + 0x20;
      }
      lVar7 = uVar6 << 5;
      for (; lVar8 < (long)uVar6; uVar6 = uVar6 - 1) {
        pcVar1 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar1[uVar6] = pcVar1[uVar6 - 1];
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)&(((C->k).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7))
        ;
        pAVar2 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar2[uVar6] = pAVar2[uVar6 - 1];
        lVar7 = lVar7 + -0x20;
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&(((C->k).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9));
      (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] = p;
      (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] = '1';
      return;
    }
    if ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar5] != '1') {
      uVar6 = uVar5 & 0xffffffff;
      goto LAB_0012f963;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void BpTree<K>::Insert_Leaf(IndexNode<K>& C, K k, Addr p) {
	this->LockNode(C);
	//�õ���Ӧ��ַ�����ã���C�޸ļ��ɶ�ԭ���޸�
	int pos, i, j;
	for (i = 0; i < N && C.v[i] == '1'; i++);							//��iλ���п�
	for (pos = 0; pos < N && C.v[pos] == '1' && C.k[pos] < k; pos++);	//pos���Ժ���Ҫ��Ǩ
	for (j = i; j > pos; j--) {
		C.v[j] = C.v[j - 1];
		C.k[j] = C.k[j - 1];
		C.p[j] = C.p[j - 1];
	}
	C.k[pos] = k;
	C.p[pos] = p;
	C.v[pos] = '1';
}